

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

bool __thiscall
QAbstractEventDispatcher::filterNativeEvent
          (QAbstractEventDispatcher *this,QByteArray *eventType,void *message,qintptr *result)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  char cVar5;
  bool bVar6;
  int i;
  ulong uVar7;
  
  lVar2 = *(long *)(this + 8);
  if (*(long *)(lVar2 + 0x88) == 0) {
    bVar6 = false;
  }
  else {
    lVar3 = *(long *)(lVar2 + 0x58);
    piVar1 = (int *)(lVar3 + 0x88);
    *piVar1 = *piVar1 + 1;
    for (uVar7 = 0; bVar6 = uVar7 < *(ulong *)(lVar2 + 0x88), uVar7 < *(ulong *)(lVar2 + 0x88);
        uVar7 = uVar7 + 1) {
      plVar4 = *(long **)(*(long *)(lVar2 + 0x80) + uVar7 * 8);
      if (plVar4 != (long *)0x0) {
        cVar5 = (**(code **)(*plVar4 + 0x10))(plVar4,eventType,message,result);
        if (cVar5 != '\0') break;
      }
    }
    piVar1 = (int *)(lVar3 + 0x88);
    *piVar1 = *piVar1 + -1;
  }
  return bVar6;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }